

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasDrawPointInternal(uint x,uint y,double alpha,Canvas *ptr)

{
  char *pcVar1;
  ulong uVar2;
  double dVar3;
  
  if (ptr != (Canvas *)0x0) {
    if ((x < (uint)ptr->width) && (y < (uint)ptr->height)) {
      pcVar1 = (ptr->data).ptr;
      uVar2 = (ulong)((ptr->width * y + x) * 4);
      dVar3 = 1.0 - alpha;
      *(float *)(pcVar1 + uVar2 * 4) =
           (float)((double)ptr->color[0] * alpha + (double)*(float *)(pcVar1 + uVar2 * 4) * dVar3);
      *(float *)(pcVar1 + uVar2 * 4 + 4) =
           (float)((double)ptr->color[1] * alpha +
                  (double)*(float *)(pcVar1 + uVar2 * 4 + 4) * dVar3);
      *(float *)(pcVar1 + uVar2 * 4 + 8) =
           (float)((double)ptr->color[2] * alpha +
                  (double)*(float *)(pcVar1 + uVar2 * 4 + 8) * dVar3);
      pcVar1 = pcVar1 + uVar2 * 4 + 0xc;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = '?';
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasDrawPointInternal(unsigned x, unsigned y, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		if(x < (unsigned)ptr->width && y < (unsigned)ptr->height)
		{
			float *pixel = &((float*)ptr->data.ptr)[y * ptr->width * 4 + x * 4];

			pixel[0] = float(ptr->color[0] * alpha + pixel[0] * (1.0 - alpha));
			pixel[1] = float(ptr->color[1] * alpha + pixel[1] * (1.0 - alpha));
			pixel[2] = float(ptr->color[2] * alpha + pixel[2] * (1.0 - alpha));
			pixel[3] = 1.0f;
		}
	}